

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O1

string * duckdb::Bit::NumericToBit<long>(string *__return_storage_ptr__,long numeric)

{
  undefined8 *puVar1;
  char *pcVar2;
  anon_union_16_2_67f50693_for_value local_28;
  
  puVar1 = (undefined8 *)operator_new__(9);
  local_28.pointer.length = 9;
  local_28._13_2_ = 0;
  local_28.inlined.inlined[0xb] = '\0';
  local_28.pointer.prefix = SUB84(*puVar1,0);
  local_28._8_4_ = (undefined4)((ulong)*puVar1 >> 0x20);
  local_28.inlined.inlined[8] = *(undefined1 *)(puVar1 + 1);
  NumericToBit<long>(numeric,(bitstring_t *)&local_28.pointer);
  if ((ulong)local_28.pointer.length < 0xd) {
    pcVar2 = local_28.pointer.prefix;
  }
  else {
    pcVar2 = (char *)CONCAT17(local_28.inlined.inlined[0xb],
                              CONCAT25(local_28._13_2_,
                                       CONCAT14(local_28.inlined.inlined[8],local_28._8_4_)));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + local_28.pointer.length);
  operator_delete__(puVar1);
  return __return_storage_ptr__;
}

Assistant:

string Bit::NumericToBit(T numeric) {
	auto bit_len = sizeof(T) + 1;
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::NumericToBit(numeric, output_str);
	return output_str.GetString();
}